

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O1

void __thiscall Fl_Widget_Type::setinactive(Fl_Widget_Type *this,Fluid_Image *i)

{
  int iVar1;
  
  if (this->inactive != i) {
    iVar1 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x21])();
    if (iVar1 == 0) {
      if (this->inactive != (Fluid_Image *)0x0) {
        Fluid_Image::decrement(this->inactive);
      }
      if (i == (Fluid_Image *)0x0) {
        this->inactive = (Fluid_Image *)0x0;
        (this->o->label_).deimage = (Fl_Image *)0x0;
      }
      else {
        Fluid_Image::increment(i);
        this->inactive = i;
        Fluid_Image::deimage(i,this->o);
      }
      redraw(this);
      return;
    }
  }
  return;
}

Assistant:

void Fl_Widget_Type::setinactive(Fluid_Image *i) {
  if (i == inactive || is_window()) return;
  if (inactive) inactive->decrement();
  if (i) i->increment();
  inactive = i;
  if (i) i->deimage(o);
  else o->deimage(0);
  redraw();
}